

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QGridLayoutBox>::insert
          (QMovableArrayOps<QGridLayoutBox> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qreal qVar1;
  QGridLayoutBox *pQVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  QGridLayoutBox *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Inserter local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = t->q_minimumSize;
  qVar4 = t->q_preferredSize;
  qVar5 = t->q_maximumSize;
  qVar6 = t->q_minimumDescent;
  qVar1 = t->q_minimumAscent;
  bVar9 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
          size != 0;
  QArrayDataPointer<QGridLayoutBox>::detachAndGrow
            ((QArrayDataPointer<QGridLayoutBox> *)this,(uint)(i == 0 && bVar9),n,
             (QGridLayoutBox **)0x0,(QArrayDataPointer<QGridLayoutBox> *)0x0);
  local_68 = SUB84(qVar3,0);
  uStack_64 = (undefined4)((ulong)qVar3 >> 0x20);
  uStack_60 = SUB84(qVar4,0);
  uStack_5c = (undefined4)((ulong)qVar4 >> 0x20);
  local_78 = SUB84(qVar5,0);
  uStack_74 = (undefined4)((ulong)qVar5 >> 0x20);
  uStack_70 = SUB84(qVar6,0);
  uStack_6c = (undefined4)((ulong)qVar6 >> 0x20);
  if (i == 0 && bVar9) {
    lVar8 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
            size;
    pQVar2 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
             ptr;
    while( true ) {
      lVar8 = lVar8 + 1;
      pQVar7 = pQVar2 + -1;
      bVar9 = n == 0;
      n = n + -1;
      if (bVar9) break;
      *(undefined4 *)&pQVar7->q_minimumSize = local_68;
      *(undefined4 *)((long)&pQVar2[-1].q_minimumSize + 4) = uStack_64;
      *(undefined4 *)&pQVar2[-1].q_preferredSize = uStack_60;
      *(undefined4 *)((long)&pQVar2[-1].q_preferredSize + 4) = uStack_5c;
      *(undefined4 *)&pQVar2[-1].q_maximumSize = local_78;
      *(undefined4 *)((long)&pQVar2[-1].q_maximumSize + 4) = uStack_74;
      *(undefined4 *)&pQVar2[-1].q_minimumDescent = uStack_70;
      *(undefined4 *)((long)&pQVar2[-1].q_minimumDescent + 4) = uStack_6c;
      pQVar2[-1].q_minimumAscent = qVar1;
      (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.ptr =
           pQVar7;
      (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.size =
           lVar8;
      pQVar2 = pQVar7;
    }
  }
  else {
    Inserter::Inserter(&local_58,(QArrayDataPointer<QGridLayoutBox> *)this,i,n);
    while (bVar9 = n != 0, n = n + -1, bVar9) {
      *(undefined4 *)&(local_58.displaceFrom)->q_minimumSize = local_68;
      *(undefined4 *)((long)&(local_58.displaceFrom)->q_minimumSize + 4) = uStack_64;
      *(undefined4 *)&(local_58.displaceFrom)->q_preferredSize = uStack_60;
      *(undefined4 *)((long)&(local_58.displaceFrom)->q_preferredSize + 4) = uStack_5c;
      *(undefined4 *)&(local_58.displaceFrom)->q_maximumSize = local_78;
      *(undefined4 *)((long)&(local_58.displaceFrom)->q_maximumSize + 4) = uStack_74;
      *(undefined4 *)&(local_58.displaceFrom)->q_minimumDescent = uStack_70;
      *(undefined4 *)((long)&(local_58.displaceFrom)->q_minimumDescent + 4) = uStack_6c;
      (local_58.displaceFrom)->q_minimumAscent = qVar1;
      local_58.displaceFrom = local_58.displaceFrom + 1;
    }
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }